

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O2

SNMP_PACKET_PARSE_ERROR __thiscall
SNMPPacket::parsePacket(SNMPPacket *this,ComplexType *structure,SNMPParsingState state)

{
  SNMP_VERSION SVar1;
  ASN_TYPE AVar2;
  pointer psVar3;
  element_type *peVar4;
  __shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  SNMPParsingState state_00;
  SNMP_PACKET_PARSE_ERROR SVar7;
  ComplexType *structure_00;
  pointer psVar8;
  SNMP_PACKET_PARSE_ERROR local_9c;
  shared_ptr<ComplexType> varbindValues;
  value_type vbOid;
  value_type vbValue;
  shared_ptr<BER_CONTAINER> local_40;
  
  psVar3 = (structure->values).
           super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar8 = (structure->values).
                super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar3; psVar8 = psVar8 + 1) {
    switch(state) {
    case SNMPVERSION:
      peVar4 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar4 == (element_type *)0x0) || (peVar4->_type != INTEGER)) {
        return -0x1e;
      }
      std::static_pointer_cast<IntegerType,BER_CONTAINER>
                ((shared_ptr<BER_CONTAINER> *)&varbindValues);
      std::__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2> *)&varbindValues);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar1 = ((this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_value;
      this->snmpVersion = SVar1;
      state = COMMUNITY;
      if (1 < (int)SVar1) {
        return -0x1e;
      }
      break;
    case COMMUNITY:
      peVar4 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar4 == (element_type *)0x0) || (peVar4->_type != STRING)) {
        return -0x1f;
      }
      std::static_pointer_cast<OctetType,BER_CONTAINER>((shared_ptr<BER_CONTAINER> *)&varbindValues)
      ;
      std::__shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->communityStringPtr).
                  super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2> *)&varbindValues);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::_M_assign((string *)&this->communityString);
      state = PDU;
      break;
    case PDU:
      structure_00 = (ComplexType *)
                     (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (structure_00 == (ComplexType *)0x0) {
        return -0x15;
      }
      AVar2 = (structure_00->super_BER_CONTAINER)._type;
      if ((AVar2 & 0xfffffff8) != GetRequestPDU) {
        return -0x15;
      }
      this->packetPDUType = AVar2;
      state_00 = REQUESTID;
      goto LAB_001594e3;
    case REQUESTID:
      peVar4 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar4 == (element_type *)0x0) || (peVar4->_type != INTEGER)) {
        return -0x21;
      }
      std::static_pointer_cast<IntegerType,BER_CONTAINER>
                ((shared_ptr<BER_CONTAINER> *)&varbindValues);
      std::__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2> *)&varbindValues);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this->requestID =
           (long)((this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_value;
      state = ERRORSTATUS;
      break;
    case ERRORSTATUS:
      peVar4 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar4 == (element_type *)0x0) || (peVar4->_type != INTEGER)) {
        return -0x22;
      }
      this->errorStatus = *(ErrorStatus *)(peVar4 + 1);
      state = ERRORID;
      break;
    case ERRORID:
      peVar4 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar4 == (element_type *)0x0) || (peVar4->_type != INTEGER)) {
        return -0x23;
      }
      this->errorIndex = *(ErrorIndex *)(peVar4 + 1);
      state = VARBINDS;
      break;
    case VARBINDS:
      structure_00 = (ComplexType *)
                     (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (structure_00 == (ComplexType *)0x0) {
        return -0x24;
      }
      if ((structure_00->super_BER_CONTAINER)._type != STRUCTURE) {
        return -0x24;
      }
      state_00 = VARBIND;
LAB_001594e3:
      SVar7 = parsePacket(this,structure_00,state_00);
      return SVar7;
    case VARBIND:
      peVar4 = (psVar8->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar4 == (element_type *)0x0) || (peVar4->_type != STRUCTURE)) {
        return -0x25;
      }
      std::static_pointer_cast<ComplexType,BER_CONTAINER>
                ((shared_ptr<BER_CONTAINER> *)&varbindValues);
      p_Var5 = &(((varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->values).
                 super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
      if ((long)((varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->values).
                super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var5 == 0x20) {
        Catch::clara::std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&vbOid.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
        if ((vbOid.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
             (element_type *)0x0) ||
           ((vbOid.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_type !=
            OID)) {
          bVar6 = false;
          local_9c = -0x15;
        }
        else {
          Catch::clara::std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&vbValue.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>,
                     &((varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->values).
                      super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>);
          std::static_pointer_cast<OIDType,BER_CONTAINER>(&local_40);
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<std::shared_ptr<OIDType>,std::shared_ptr<BER_CONTAINER>&>
                    ((deque<VarBind,std::allocator<VarBind>> *)&this->varbindList,
                     (shared_ptr<OIDType> *)&local_40,(shared_ptr<BER_CONTAINER> *)&vbValue);
          Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_40.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&vbValue.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          bVar6 = true;
        }
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&vbOid.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      else {
        bVar6 = false;
        local_9c = -0x25;
      }
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      state = VARBIND;
      if (!bVar6) {
        return local_9c;
      }
      break;
    case DONE:
      goto LAB_00159491;
    }
  }
LAB_00159491:
  return 1;
}

Assistant:

SNMP_PACKET_PARSE_ERROR SNMPPacket::parsePacket(ComplexType *structure, enum SNMPParsingState state) {
    for(const auto& value : structure->values){
        if(state == DONE) break;

        switch(state) {

            case SNMPVERSION:
                ASSERT_ASN_STATE_TYPE(value, SNMPVERSION);
                this->snmpVersionPtr = std::static_pointer_cast<IntegerType>(value);
                this->snmpVersion = (SNMP_VERSION) this->snmpVersionPtr.get()->_value;
                if (this->snmpVersion >= SNMP_VERSION_MAX) {
                    SNMP_LOGW("Invalid SNMP Version: %d\n", this->snmpVersion);
                    return SNMP_PARSE_ERROR_AT_STATE(SNMPVERSION);
                };
                state = COMMUNITY;
            break;

            case COMMUNITY:
                ASSERT_ASN_STATE_TYPE(value, COMMUNITY);
                this->communityStringPtr = std::static_pointer_cast<OctetType>(value);
                this->communityString = this->communityStringPtr.get()->_value;
                state = PDU;
            break;

            case PDU:
                ASSERT_ASN_PARSING_TYPE_RANGE(value, ASN_PDU_TYPE_MIN_VALUE, ASN_PDU_TYPE_MAX_VALUE)
                this->packetPDUType = value->_type;
                return this->parsePacket(static_cast<ComplexType*>(value.get()), REQUESTID);

            case REQUESTID:
                ASSERT_ASN_STATE_TYPE(value, REQUESTID);
                this->requestIDPtr = std::static_pointer_cast<IntegerType>(value);
                this->requestID = this->requestIDPtr.get()->_value;
                state = ERRORSTATUS;
            break;

            case ERRORSTATUS:
                ASSERT_ASN_STATE_TYPE(value, ERRORSTATUS);
                this->errorStatus.errorStatus = (SNMP_ERROR_STATUS) static_cast<IntegerType *>(value.get())->_value;
                state = ERRORID;
            break;

            case ERRORID:
                ASSERT_ASN_STATE_TYPE(value, ERRORID);
                this->errorIndex.errorIndex = static_cast<IntegerType*>(value.get())->_value;
                state = VARBINDS;
            break;

            case VARBINDS:
                ASSERT_ASN_STATE_TYPE(value, VARBINDS);
                // we have a varbind structure, lets dive into it.
                return this->parsePacket(static_cast<ComplexType*>(value.get()), VARBIND);

            case VARBIND:
            {
                ASSERT_ASN_STATE_TYPE(value, VARBIND);
                // we are in a single varbind

                auto varbindValues = std::static_pointer_cast<ComplexType>(value);

                if (varbindValues->values.size() != 2) {
                    SNMP_LOGW("Expecting VARBIND TO CONTAIN 2 OBEJCTS; %lu\n",
                              varbindValues ? varbindValues->values.size() : 0);
                    return SNMP_PARSE_ERROR_AT_STATE(VARBIND);
                };

                auto vbOid = varbindValues->values[0];
                ASSERT_ASN_TYPE_AT_STATE(vbOid, OID, VARBIND);

                auto vbValue = varbindValues->values[1];
                this->varbindList.emplace_back(
                    std::static_pointer_cast<OIDType>(vbOid),
                    vbValue
                );
            }
            break;

            case DONE:
                return true;
        }
    }
    return SNMP_ERROR_OK;
}